

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O1

char * pty_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,Conf *conf,
               char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  Backend *pBVar1;
  char *pcVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  ssh_ttymodes modes;
  undefined8 auStack_a58 [161];
  undefined4 local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538 [161];
  undefined4 local_30;
  
  bVar6 = 0;
  memset(local_538,0,0x50c);
  pcVar2 = (char *)0x0;
  if (pty_argv != (char **)0x0) {
    pcVar2 = (char *)0x0;
    if ((*pty_argv != (char *)0x0) && (pty_argv[1] == (char *)0x0)) {
      pcVar2 = *pty_argv;
    }
  }
  if (vt == &pty_backend) {
    puVar4 = local_538;
    puVar5 = auStack_a58;
    for (lVar3 = 0xa1; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    local_550 = local_30;
    local_548 = 0;
    uStack_540 = 0;
    pBVar1 = pty_backend_create(seat,puVar4,conf,pty_argv,pcVar2,0);
    *backend_handle = pBVar1;
    pcVar2 = dupstr("");
    *realhost = pcVar2;
    return (char *)0x0;
  }
  __assert_fail("vt == &pty_backend",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pty.c",0x50c
                ,
                "char *pty_init(const BackendVtable *, Seat *, Backend **, LogContext *, Conf *, const char *, int, char **, _Bool, _Bool)"
               );
}

Assistant:

static char *pty_init(const BackendVtable *vt, Seat *seat,
                      Backend **backend_handle, LogContext *logctx,
                      Conf *conf, const char *host, int port,
                      char **realhost, bool nodelay, bool keepalive)
{
    const char *cmd = NULL;
    struct ssh_ttymodes modes;

    memset(&modes, 0, sizeof(modes));

    if (pty_argv && pty_argv[0] && !pty_argv[1])
        cmd = pty_argv[0];

    assert(vt == &pty_backend);
    *backend_handle = pty_backend_create(
        seat, logctx, conf, pty_argv, cmd, modes, false, NULL, NULL);
    *realhost = dupstr("");
    return NULL;
}